

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-cat.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  size_t __ptr;
  BigFile BVar2;
  int iVar3;
  long lVar4;
  char *size_00;
  ulong uVar5;
  BigFile *pBVar6;
  BigFile BVar7;
  char *pcVar8;
  char str [300];
  undefined1 local_410 [8];
  BigArrayIter iter;
  BigArray array;
  BigBlock bb;
  BigFile local_60;
  size_t buffersize;
  BigFile local_50;
  BigFile bf;
  ptrdiff_t start;
  BigFile local_38;
  ptrdiff_t size;
  
  local_50.basename = (char *)0x0;
  array.data = (void *)0x0;
  bf.basename = (char *)0x0;
  local_38.basename = (char *)0xffffffffffffffff;
  local_60.basename = (char *)0x10000000;
  bVar1 = true;
  buffersize = 0;
  do {
    while( true ) {
      while (iVar3 = getopt(argc,argv,"bo:c:B:f:"), 0x62 < iVar3) {
        if (iVar3 == 99) {
          pBVar6 = &local_38;
          goto LAB_001025c7;
        }
        if (iVar3 == 0x6f) {
          pBVar6 = &bf;
          goto LAB_001025c7;
        }
        if (iVar3 != 0x66) goto LAB_00102861;
        buffersize = _optarg;
      }
      if (iVar3 != 0x42) break;
      pBVar6 = &local_60;
LAB_001025c7:
      __isoc99_sscanf(_optarg,"%td",pBVar6);
    }
    if (iVar3 == -1) {
      lVar4 = (long)_optind;
      if (argc - _optind == 2) {
        iVar3 = big_file_open(&local_50,argv[lVar4]);
        if (iVar3 != 0) goto LAB_0010286b;
        iVar3 = big_file_open_block(&local_50,(BigBlock *)&array.data,(argv + lVar4)[1]);
        if (iVar3 != 0) goto LAB_00102873;
        if (bf.basename + local_38.basename != (char *)0x0 ||
            local_38.basename == (char *)0xffffffffffffffff) {
          local_38.basename = -bf.basename;
        }
        count = (size_t)local_38.basename;
        signal(10,usr1);
        BVar7.basename = local_60.basename;
        pcVar8 = local_38.basename + bf.basename;
        big_file_dtype_itemsize((char *)&array.data);
        if ((long)pcVar8 <= (long)bf.basename) goto LAB_00102838;
        size_00 = (char *)(BVar7.basename / 0);
        BVar7 = bf;
        while( true ) {
          BVar2.basename = local_38.basename;
          if (size_00 < local_38.basename) {
            BVar2.basename = size_00;
          }
          size_00 = BVar2.basename;
          iVar3 = big_block_read_simple
                            ((BigBlock *)&array.data,(ptrdiff_t)BVar7.basename,(ptrdiff_t)size_00,
                             (BigArray *)&iter.dataptr,(char *)0x0);
          __ptr = array.size;
          if (iVar3 != 0) break;
          if (bVar1) {
            big_array_iter_init((BigArrayIter *)local_410,(BigArray *)&iter.dataptr);
            if (array._8_8_ != 0) {
              uVar5 = 0;
              do {
                fputc(10,_stdout);
                uVar5 = uVar5 + 1;
              } while (uVar5 < (ulong)array._8_8_);
            }
          }
          else {
            iVar3 = big_file_dtype_itemsize((char *)&array.data);
            fwrite((void *)__ptr,(long)iVar3,array.strides[0x1f],_stdout);
          }
          free((void *)array.size);
          BVar7.basename = BVar7.basename + array._8_8_;
          countin = countin + array._8_8_;
          if ((long)pcVar8 <= (long)BVar7.basename) {
LAB_00102838:
            big_block_close((BigBlock *)&array.data);
            big_file_close(&local_50);
            return 0;
          }
        }
      }
      else {
LAB_00102861:
        usage();
      }
      main_cold_3();
LAB_0010286b:
      main_cold_1();
LAB_00102873:
      main_cold_2();
      fwrite("usage: bigfile-cat [-b] [-o offset] [-c count] [-B buffersize] filepath block \n",0x4f
             ,1,_stderr);
      fwrite("-b direct binary dump \n",0x17,1,_stderr);
      fwrite("-o seek to item at offset \n",0x1b,1,_stderr);
      fwrite("-c read item count \n",0x14,1,_stderr);
      fwrite("-B blocksize in bytes used in IO \n",0x22,1,_stderr);
      exit(1);
    }
    if (iVar3 != 0x62) goto LAB_00102861;
    bVar1 = false;
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};
    int opt;

    int humane = 1; /* binary or ascii */
    ptrdiff_t start = 0;
    ptrdiff_t size = -1;

    size_t buffersize = 256 * 1024 * 1024;

    char * fmt = NULL;

    while(-1 != (opt = getopt(argc, argv, "bo:c:B:f:"))) {
        switch(opt) {
            case 'f':
                fmt = optarg;
                break;
            case 'b':
                humane = 0;
                break;
            case 'o':
                sscanf(optarg, "%td", &start);
                break;
            case 'c':
                sscanf(optarg, "%td", &size);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            default:
                usage();
        }
    }
    if(argc - optind != 2) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    if(size == -1 || bb.size < size + start) {
        size = bb.size - start;
    } 

    count = size;

    signal(SIGUSR1, usr1);

    ptrdiff_t end = start + size;

    size_t chunksize = buffersize / (bb.nmemb * big_file_dtype_itemsize(bb.dtype));
    BigBlockPtr ptr;
    BigBlockPtr ptrnew;
    ptrdiff_t offset;
    BigArray array;

    for(offset = start; offset < end; ) {
        if(chunksize > size) chunksize = size;
        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            exit(1);
        }

        if(!humane) {
            fwrite(array.data, big_file_dtype_itemsize(bb.dtype), array.size, stdout);
        } else {
            char str[300];
            BigArrayIter iter;
            big_array_iter_init(&iter, &array);
            size_t i;
            for(i = 0; i < array.dims[0]; i++) {
                int j;
                for(j = 0; j < bb.nmemb; j ++) {
                    big_file_dtype_format(str, array.dtype, iter.dataptr, fmt);
                    big_array_iter_advance(&iter);
                    fprintf(stdout, "%s ", str);
                }
                fprintf(stdout, "\n");
            }
        }
        free(array.data);
        offset += array.dims[0];
        countin += array.dims[0];
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}